

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3StrAccumReset(StrAccum *p)

{
  char *p_00;
  
  p_00 = p->zText;
  if (p_00 != p->zBase) {
    if (p->useMalloc == '\x01') {
      sqlite3DbFree(p->db,p_00);
    }
    else {
      sqlite3_free(p_00);
    }
  }
  p->zText = (char *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumReset(StrAccum *p){
  if( p->zText!=p->zBase ){
    if( p->useMalloc==1 ){
      sqlite3DbFree(p->db, p->zText);
    }else{
      sqlite3_free(p->zText);
    }
  }
  p->zText = 0;
}